

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty-format.c
# Opt level: O3

size_t rtosc_scan_message(char *src,char *address,size_t adrsize,rtosc_arg_val_t *args,size_t n,
                         char *buffer_for_strings,size_t bufsize)

{
  ushort **ppuVar1;
  long lVar2;
  size_t sVar3;
  ulong uVar4;
  char *pcVar5;
  char cVar6;
  int local_4c;
  rtosc_arg_val_t *local_48;
  size_t local_40;
  char *local_38;
  
  cVar6 = *src;
  local_48 = args;
  local_40 = n;
  local_38 = buffer_for_strings;
  if (cVar6 == '\0') {
    uVar4 = 0;
  }
  else {
    ppuVar1 = __ctype_b_loc();
    uVar4 = 0;
LAB_0010f617:
    if ((*(byte *)((long)*ppuVar1 + (long)cVar6 * 2 + 1) & 0x20) != 0) goto code_r0x0010f622;
    src = src + uVar4;
    if (cVar6 != '%') goto LAB_0010f680;
    pcVar5 = src;
    do {
      local_4c = 0;
      __isoc99_sscanf(pcVar5,"%*[^\n] %n",&local_4c);
      lVar2 = (long)local_4c;
      src = pcVar5 + lVar2;
      uVar4 = uVar4 + lVar2;
      cVar6 = pcVar5[lVar2];
      pcVar5 = src;
    } while (cVar6 == '%');
    if (cVar6 != '\0') {
LAB_0010f680:
      ppuVar1 = __ctype_b_loc();
      while (((*(byte *)((long)*ppuVar1 + (long)cVar6 * 2 + 1) & 0x20) == 0 && (uVar4 < adrsize))) {
        *address = cVar6;
        address = address + 1;
        uVar4 = uVar4 + 1;
        cVar6 = src[1];
        src = src + 1;
        if (cVar6 == '\0') break;
      }
    }
  }
LAB_0010f6af:
  *address = '\0';
  cVar6 = *src;
  if (cVar6 != '\0') {
    ppuVar1 = __ctype_b_loc();
    do {
      if ((*(byte *)((long)*ppuVar1 + (long)cVar6 * 2 + 1) & 0x20) == 0) break;
      uVar4 = uVar4 + 1;
      cVar6 = src[1];
      src = src + 1;
    } while (cVar6 != '\0');
  }
  sVar3 = rtosc_scan_arg_vals(src,local_48,local_40,local_38,bufsize);
  return sVar3 + uVar4;
code_r0x0010f622:
  cVar6 = src[uVar4 + 1];
  uVar4 = uVar4 + 1;
  if (cVar6 == '\0') goto code_r0x0010f62f;
  goto LAB_0010f617;
code_r0x0010f62f:
  src = src + uVar4;
  goto LAB_0010f6af;
}

Assistant:

size_t rtosc_scan_message(const char* src,
                          char* address, size_t adrsize,
                          rtosc_arg_val_t *args, size_t n,
                          char* buffer_for_strings, size_t bufsize)
{
    size_t rd = 0;
    for(;*src && isspace(*src); ++src) ++rd;
    while (*src == '%')
        rd += skip_fmt(&src, "%*[^\n] %n");

    assert(*src == '/');
    for(; *src && !isspace(*src) && rd < adrsize; ++rd)
        *address++ = *src++;
    assert(rd < adrsize); // otherwise, the address was too long
    *address = 0;

    for(;*src && isspace(*src); ++src) ++rd;

    rd += rtosc_scan_arg_vals(src, args, n, buffer_for_strings, bufsize);

    return rd;
}